

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtarga.c
# Opt level: O0

JDIMENSION get_24bit_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  undefined1 *puVar1;
  long in_RSI;
  long in_RDI;
  JDIMENSION col;
  JSAMPROW ptr;
  tga_source_ptr source;
  int local_24;
  undefined1 *local_20;
  
  local_20 = (undefined1 *)**(undefined8 **)(in_RSI + 0x20);
  for (local_24 = *(int *)(in_RDI + 0x30); local_24 != 0; local_24 = local_24 + -1) {
    (**(code **)(in_RSI + 0x50))(in_RSI);
    *local_20 = *(undefined1 *)(in_RSI + 0x5a);
    puVar1 = local_20 + 2;
    local_20[1] = *(undefined1 *)(in_RSI + 0x59);
    local_20 = local_20 + 3;
    *puVar1 = *(undefined1 *)(in_RSI + 0x58);
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_24bit_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading 24-bit pixels */
{
  tga_source_ptr source = (tga_source_ptr)sinfo;
  register JSAMPROW ptr;
  register JDIMENSION col;

  ptr = source->pub.buffer[0];
  for (col = cinfo->image_width; col > 0; col--) {
    (*source->read_pixel) (source); /* Load next pixel into tga_pixel */
    *ptr++ = (JSAMPLE)UCH(source->tga_pixel[2]); /* change BGR to RGB order */
    *ptr++ = (JSAMPLE)UCH(source->tga_pixel[1]);
    *ptr++ = (JSAMPLE)UCH(source->tga_pixel[0]);
  }
  return 1;
}